

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWaitEventsTimeout(double timeout)

{
  double in_XMM0_Qa;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_XMM0_Qa < 0.0) || (1.79769313486232e+308 < in_XMM0_Qa)) {
    _glfwInputError((int)in_XMM0_Qa,(char *)0x10004,"Invalid time %f");
  }
  else {
    _glfwPlatformWaitEventsTimeout(2.83994614984476e-317);
  }
  return;
}

Assistant:

GLFWAPI void glfwWaitEventsTimeout(double timeout)
{
    _GLFW_REQUIRE_INIT();
    assert(timeout == timeout);
    assert(timeout >= 0.0);
    assert(timeout <= DBL_MAX);

    if (timeout != timeout || timeout < 0.0 || timeout > DBL_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid time %f", timeout);
        return;
    }

    _glfwPlatformWaitEventsTimeout(timeout);
}